

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-flow-take.c
# Opt level: O0

void borg_delete_take(wchar_t i)

{
  borg_take *__s;
  char *what;
  borg_take *take;
  borg_grid *ag;
  wchar_t i_local;
  
  __s = borg_takes + i;
  if (__s->kind != (object_kind *)0x0) {
    if (*borg_cfg != 0) {
      what = format("# Forgetting an object \'%s\' at (%d,%d)",__s->kind->name,(ulong)__s->y,
                    (ulong)__s->x);
      borg_note(what);
    }
    borg_grids[__s->y][__s->x].take = '\0';
    memset(__s,0,0x18);
    borg_takes_cnt = borg_takes_cnt + -1;
    if (borg.goal.type == 2) {
      borg.goal.type = 0;
    }
  }
  return;
}

Assistant:

void borg_delete_take(int i)
{
    borg_grid *ag;

    borg_take *take = &borg_takes[i];

    /* Paranoia -- Already wiped */
    if (!take->kind)
        return;

    /* Note */
    if (borg_cfg[BORG_VERBOSE])
        borg_note(format("# Forgetting an object '%s' at (%d,%d)",
            (take->kind->name), take->y, take->x));

    /* Access the grid */
    ag = &borg_grids[take->y][take->x];

    /* Forget it */
    ag->take = 0;

    /* Kill the object */
    memset(take, 0, sizeof(borg_take));

    /* One less object */
    borg_takes_cnt--;

    /* Wipe goals */
    if (borg.goal.type == GOAL_TAKE)
        borg.goal.type = 0;
}